

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_objects_detector.cpp
# Opt level: O1

void __thiscall
feintrack::SimpleLeftObjectsDetector::DelFromShadyLeftObjects
          (SimpleLeftObjectsDetector *this,uint obj_uid)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  
  p_Var2 = (_List_node_base *)&this->shady_left_objects;
  do {
    p_Var2 = (((_List_base<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_> *)
              &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)&this->shady_left_objects) {
      return;
    }
  } while (*(uint *)((long)&p_Var2[2]._M_next + 4) != obj_uid);
  psVar1 = &(this->shady_left_objects).
            super__List_base<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var2,0x30);
  return;
}

Assistant:

void SimpleLeftObjectsDetector::DelFromShadyLeftObjects(
        unsigned int obj_uid
        )
{
    for (auto iter = shady_left_objects.begin(); iter != shady_left_objects.end(); ++iter)
    {
        if (iter->obj_uid == obj_uid)
        {
            iter = shady_left_objects.erase(iter);
            return;
        }
    }
}